

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::MethodOptions::_InternalParse(MethodOptions *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  uint64 uVar3;
  UninterpretedOption *msg;
  UnknownFieldSet *this_00;
  char cVar4;
  char *local_50;
  uint local_48;
  uint32 tag;
  InternalMetadataWithArena *local_40;
  ExtensionSet *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->_extensions_;
  local_48 = 0;
  local_50 = ptr;
LAB_002c3765:
  do {
    bVar2 = internal::ParseContext::Done(ctx,&local_50);
    if (bVar2) goto LAB_002c38e9;
    local_50 = internal::ReadTag(local_50,&tag,0);
    if (local_50 == (char *)0x0) goto LAB_002c390b;
    uVar1 = tag >> 3;
    cVar4 = (char)tag;
    if (uVar1 == 999) {
      if (cVar4 == ':') {
        local_50 = local_50 + -2;
        do {
          local_50 = local_50 + 2;
          msg = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                          (&this->uninterpreted_option_);
          local_50 = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (ctx,msg,local_50);
          if (local_50 == (char *)0x0) goto LAB_002c390b;
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (bVar2 = internal::ExpectTag<7994u>(local_50), bVar2));
        goto LAB_002c3765;
      }
LAB_002c386e:
      if (((ulong)tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_002c38e9;
      }
      if (tag < 8000) {
        local_50 = internal::UnknownFieldParse(tag,local_40,local_50,ctx);
      }
      else {
        local_50 = internal::ExtensionSet::ParseField
                             (local_38,(ulong)tag,local_50,
                              (Message *)_MethodOptions_default_instance_,local_40,ctx);
      }
    }
    else {
      if (uVar1 == 0x22) {
        if (cVar4 != '\x10') goto LAB_002c386e;
        uVar3 = internal::ReadVarint(&local_50);
        if (local_50 == (char *)0x0) goto LAB_002c390b;
        if ((uint)uVar3 < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this->idempotency_level_ = (uint)uVar3;
        }
        else {
          this_00 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(this_00,0x22,uVar3);
        }
        goto LAB_002c3765;
      }
      if ((uVar1 != 0x21) || (cVar4 != '\b')) goto LAB_002c386e;
      uVar3 = internal::ReadVarint(&local_50);
      this->deprecated_ = uVar3 != 0;
      local_48 = 1;
    }
    if (local_50 == (char *)0x0) {
LAB_002c390b:
      local_50 = (char *)0x0;
LAB_002c38e9:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_48;
      return local_50;
    }
  } while( true );
}

Assistant:

const char* MethodOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel_IsValid(val))) {
            _internal_set_idempotency_level(static_cast<PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(34, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}